

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint uVar31;
  undefined4 uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  float fVar52;
  float fVar53;
  undefined1 auVar51 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  float fVar77;
  undefined1 auVar76 [64];
  undefined1 auVar78 [64];
  uint uVar79;
  uint uVar80;
  float fVar81;
  uint uVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  float local_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  Scene *local_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [16];
  long local_2630;
  long local_2628;
  ulong local_2620;
  undefined1 (*local_2618) [16];
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  float local_2550 [4];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [16];
  RTCHitN local_2510 [16];
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar44 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar32;
  local_23c0._0_4_ = uVar32;
  local_23c0._8_4_ = uVar32;
  local_23c0._12_4_ = uVar32;
  local_23c0._16_4_ = uVar32;
  local_23c0._20_4_ = uVar32;
  local_23c0._24_4_ = uVar32;
  local_23c0._28_4_ = uVar32;
  auVar75 = ZEXT3264(local_23c0);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar32;
  local_23e0._0_4_ = uVar32;
  local_23e0._8_4_ = uVar32;
  local_23e0._12_4_ = uVar32;
  local_23e0._16_4_ = uVar32;
  local_23e0._20_4_ = uVar32;
  local_23e0._24_4_ = uVar32;
  local_23e0._28_4_ = uVar32;
  auVar76 = ZEXT3264(local_23e0);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar32;
  local_2400._0_4_ = uVar32;
  local_2400._8_4_ = uVar32;
  local_2400._12_4_ = uVar32;
  local_2400._16_4_ = uVar32;
  local_2400._20_4_ = uVar32;
  local_2400._24_4_ = uVar32;
  local_2400._28_4_ = uVar32;
  auVar78 = ZEXT3264(local_2400);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar43 = uVar38 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar2;
  local_2480._0_4_ = iVar2;
  local_2480._8_4_ = iVar2;
  local_2480._12_4_ = iVar2;
  local_2480._16_4_ = iVar2;
  local_2480._20_4_ = iVar2;
  local_2480._24_4_ = iVar2;
  local_2480._28_4_ = iVar2;
  auVar102 = ZEXT3264(local_2480);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar51 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2618 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_2420 = fVar45;
  fStack_241c = fVar45;
  fStack_2418 = fVar45;
  fStack_2414 = fVar45;
  fStack_2410 = fVar45;
  fStack_240c = fVar45;
  fStack_2408 = fVar45;
  fStack_2404 = fVar45;
  local_2440 = fVar52;
  fStack_243c = fVar52;
  fStack_2438 = fVar52;
  fStack_2434 = fVar52;
  fStack_2430 = fVar52;
  fStack_242c = fVar52;
  fStack_2428 = fVar52;
  fStack_2424 = fVar52;
  local_2460 = fVar53;
  fStack_245c = fVar53;
  fStack_2458 = fVar53;
  fStack_2454 = fVar53;
  fStack_2450 = fVar53;
  fStack_244c = fVar53;
  fStack_2448 = fVar53;
  fStack_2444 = fVar53;
  fVar54 = fVar45;
  fVar77 = fVar45;
  fVar81 = fVar45;
  fVar83 = fVar45;
  fVar84 = fVar45;
  fVar85 = fVar45;
  fVar86 = fVar52;
  fVar87 = fVar52;
  fVar88 = fVar52;
  fVar89 = fVar52;
  fVar90 = fVar52;
  fVar91 = fVar52;
  fVar96 = fVar53;
  fVar97 = fVar53;
  fVar98 = fVar53;
  fVar99 = fVar53;
  fVar100 = fVar53;
  fVar101 = fVar53;
LAB_00fd0fc7:
  do {
    do {
      if (pauVar44 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar33 = pauVar44 + -1;
      pauVar44 = pauVar44 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar33 + 8));
    uVar40 = *(ulong *)*pauVar44;
    while ((uVar40 & 8) == 0) {
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar38),auVar75._0_32_);
      auVar7._4_4_ = fVar54 * auVar6._4_4_;
      auVar7._0_4_ = fVar45 * auVar6._0_4_;
      auVar7._8_4_ = fVar77 * auVar6._8_4_;
      auVar7._12_4_ = fVar81 * auVar6._12_4_;
      auVar7._16_4_ = fVar83 * auVar6._16_4_;
      auVar7._20_4_ = fVar84 * auVar6._20_4_;
      auVar7._24_4_ = fVar85 * auVar6._24_4_;
      auVar7._28_4_ = auVar6._28_4_;
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar41),auVar76._0_32_);
      auVar8._4_4_ = fVar86 * auVar6._4_4_;
      auVar8._0_4_ = fVar52 * auVar6._0_4_;
      auVar8._8_4_ = fVar87 * auVar6._8_4_;
      auVar8._12_4_ = fVar88 * auVar6._12_4_;
      auVar8._16_4_ = fVar89 * auVar6._16_4_;
      auVar8._20_4_ = fVar90 * auVar6._20_4_;
      auVar8._24_4_ = fVar91 * auVar6._24_4_;
      auVar8._28_4_ = auVar6._28_4_;
      auVar6 = vmaxps_avx(auVar7,auVar8);
      auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar42),auVar78._0_32_);
      auVar9._4_4_ = fVar96 * auVar7._4_4_;
      auVar9._0_4_ = fVar53 * auVar7._0_4_;
      auVar9._8_4_ = fVar97 * auVar7._8_4_;
      auVar9._12_4_ = fVar98 * auVar7._12_4_;
      auVar9._16_4_ = fVar99 * auVar7._16_4_;
      auVar9._20_4_ = fVar100 * auVar7._20_4_;
      auVar9._24_4_ = fVar101 * auVar7._24_4_;
      auVar9._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar9,auVar102._0_32_);
      local_25e0 = vmaxps_avx(auVar6,auVar7);
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar43),auVar75._0_32_);
      auVar10._4_4_ = fVar54 * auVar6._4_4_;
      auVar10._0_4_ = fVar45 * auVar6._0_4_;
      auVar10._8_4_ = fVar77 * auVar6._8_4_;
      auVar10._12_4_ = fVar81 * auVar6._12_4_;
      auVar10._16_4_ = fVar83 * auVar6._16_4_;
      auVar10._20_4_ = fVar84 * auVar6._20_4_;
      auVar10._24_4_ = fVar85 * auVar6._24_4_;
      auVar10._28_4_ = auVar6._28_4_;
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + (uVar41 ^ 0x20)),auVar76._0_32_);
      auVar11._4_4_ = fVar86 * auVar6._4_4_;
      auVar11._0_4_ = fVar52 * auVar6._0_4_;
      auVar11._8_4_ = fVar87 * auVar6._8_4_;
      auVar11._12_4_ = fVar88 * auVar6._12_4_;
      auVar11._16_4_ = fVar89 * auVar6._16_4_;
      auVar11._20_4_ = fVar90 * auVar6._20_4_;
      auVar11._24_4_ = fVar91 * auVar6._24_4_;
      auVar11._28_4_ = auVar6._28_4_;
      auVar6 = vminps_avx(auVar10,auVar11);
      auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar40 + 0x40 + (uVar42 ^ 0x20)),auVar78._0_32_);
      auVar12._4_4_ = fVar96 * auVar7._4_4_;
      auVar12._0_4_ = fVar53 * auVar7._0_4_;
      auVar12._8_4_ = fVar97 * auVar7._8_4_;
      auVar12._12_4_ = fVar98 * auVar7._12_4_;
      auVar12._16_4_ = fVar99 * auVar7._16_4_;
      auVar12._20_4_ = fVar100 * auVar7._20_4_;
      auVar12._24_4_ = fVar101 * auVar7._24_4_;
      auVar12._28_4_ = auVar7._28_4_;
      auVar7 = vminps_avx(auVar12,auVar51._0_32_);
      auVar6 = vminps_avx(auVar6,auVar7);
      auVar6 = vcmpps_avx(local_25e0,auVar6,2);
      uVar31 = vmovmskps_avx(auVar6);
      if (uVar31 == 0) goto LAB_00fd0fc7;
      uVar31 = uVar31 & 0xff;
      uVar37 = uVar40 & 0xfffffffffffffff0;
      lVar35 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      uVar40 = *(ulong *)(uVar37 + lVar35 * 8);
      uVar31 = uVar31 - 1 & uVar31;
      if (uVar31 != 0) {
        uVar79 = *(uint *)(local_25e0 + lVar35 * 4);
        lVar35 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        uVar3 = *(ulong *)(uVar37 + lVar35 * 8);
        uVar80 = *(uint *)(local_25e0 + lVar35 * 4);
        uVar31 = uVar31 - 1 & uVar31;
        if (uVar31 == 0) {
          if (uVar79 < uVar80) {
            *(ulong *)*pauVar44 = uVar3;
            *(uint *)(*pauVar44 + 8) = uVar80;
            pauVar44 = pauVar44 + 1;
          }
          else {
            *(ulong *)*pauVar44 = uVar40;
            *(uint *)(*pauVar44 + 8) = uVar79;
            uVar40 = uVar3;
            pauVar44 = pauVar44 + 1;
          }
        }
        else {
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar40;
          auVar55 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar79));
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar3;
          auVar67 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar80));
          lVar35 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(uVar37 + lVar35 * 8);
          auVar56 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_25e0 + lVar35 * 4)));
          auVar73 = vpcmpgtd_avx(auVar67,auVar55);
          uVar31 = uVar31 - 1 & uVar31;
          if (uVar31 == 0) {
            auVar74 = vpshufd_avx(auVar73,0xaa);
            auVar73 = vblendvps_avx(auVar67,auVar55,auVar74);
            auVar55 = vblendvps_avx(auVar55,auVar67,auVar74);
            auVar67 = vpcmpgtd_avx(auVar56,auVar73);
            auVar74 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar56,auVar73,auVar74);
            auVar73 = vblendvps_avx(auVar73,auVar56,auVar74);
            auVar56 = vpcmpgtd_avx(auVar73,auVar55);
            auVar74 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar73,auVar55,auVar74);
            auVar55 = vblendvps_avx(auVar55,auVar73,auVar74);
            *pauVar44 = auVar55;
            pauVar44[1] = auVar56;
            uVar40 = auVar67._0_8_;
            pauVar44 = pauVar44 + 2;
          }
          else {
            lVar35 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(uVar37 + lVar35 * 8);
            auVar74 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_25e0 + lVar35 * 4)));
            uVar31 = uVar31 - 1 & uVar31;
            uVar40 = (ulong)uVar31;
            if (uVar31 == 0) {
              auVar46 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar67,auVar55,auVar46);
              auVar55 = vblendvps_avx(auVar55,auVar67,auVar46);
              auVar67 = vpcmpgtd_avx(auVar74,auVar56);
              auVar46 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar74,auVar56,auVar46);
              auVar56 = vblendvps_avx(auVar56,auVar74,auVar46);
              auVar74 = vpcmpgtd_avx(auVar56,auVar55);
              auVar46 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar56,auVar55,auVar46);
              auVar55 = vblendvps_avx(auVar55,auVar56,auVar46);
              auVar56 = vpcmpgtd_avx(auVar67,auVar73);
              auVar46 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar67,auVar73,auVar46);
              auVar67 = vblendvps_avx(auVar73,auVar67,auVar46);
              auVar73 = vpcmpgtd_avx(auVar74,auVar67);
              auVar46 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar74,auVar67,auVar46);
              auVar67 = vblendvps_avx(auVar67,auVar74,auVar46);
              *pauVar44 = auVar55;
              pauVar44[1] = auVar67;
              pauVar44[2] = auVar73;
              uVar40 = auVar56._0_8_;
              pauVar44 = pauVar44 + 3;
            }
            else {
              *pauVar44 = auVar55;
              pauVar44[1] = auVar67;
              pauVar44[2] = auVar56;
              pauVar33 = pauVar44 + 3;
              pauVar44[3] = auVar74;
              do {
                lVar35 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar37 + lVar35 * 8);
                auVar55 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_25e0 + lVar35 * 4)));
                pauVar33[1] = auVar55;
                pauVar33 = pauVar33 + 1;
                uVar40 = uVar40 & uVar40 - 1;
              } while (uVar40 != 0);
              lVar35 = 0;
              while (pauVar33 != pauVar44) {
                auVar55 = pauVar44[1];
                uVar31 = vextractps_avx(auVar55,2);
                for (lVar39 = 0x10;
                    (lVar35 != lVar39 && (*(uint *)(pauVar44[-1] + lVar39 + 8) < uVar31));
                    lVar39 = lVar39 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar44 + lVar39) =
                       *(undefined1 (*) [16])(pauVar44[-1] + lVar39);
                }
                *(undefined1 (*) [16])(*pauVar44 + lVar39) = auVar55;
                lVar35 = lVar35 + -0x10;
                pauVar44 = pauVar44 + 1;
              }
              uVar40 = *(ulong *)*pauVar33;
              pauVar44 = pauVar33;
            }
          }
        }
      }
    }
    lVar35 = (ulong)((uint)uVar40 & 0xf) - 8;
    uVar40 = uVar40 & 0xfffffffffffffff0;
    for (lVar39 = 0; lVar39 != lVar35; lVar39 = lVar39 + 1) {
      lVar36 = lVar39 * 0xb0;
      pfVar1 = (float *)(uVar40 + 0x80 + lVar36);
      fVar96 = *pfVar1;
      fVar97 = pfVar1[1];
      fVar98 = pfVar1[2];
      fVar99 = pfVar1[3];
      pfVar1 = (float *)(uVar40 + 0x40 + lVar36);
      fVar100 = *pfVar1;
      fVar101 = pfVar1[1];
      fVar13 = pfVar1[2];
      fVar14 = pfVar1[3];
      auVar46._0_4_ = fVar96 * fVar100;
      auVar46._4_4_ = fVar97 * fVar101;
      auVar46._8_4_ = fVar98 * fVar13;
      auVar46._12_4_ = fVar99 * fVar14;
      pfVar1 = (float *)(uVar40 + 0x70 + lVar36);
      fVar15 = *pfVar1;
      fVar16 = pfVar1[1];
      fVar17 = pfVar1[2];
      fVar18 = pfVar1[3];
      pfVar1 = (float *)(uVar40 + 0x50 + lVar36);
      fVar19 = *pfVar1;
      fVar20 = pfVar1[1];
      fVar21 = pfVar1[2];
      fVar22 = pfVar1[3];
      auVar57._0_4_ = fVar15 * fVar19;
      auVar57._4_4_ = fVar16 * fVar20;
      auVar57._8_4_ = fVar17 * fVar21;
      auVar57._12_4_ = fVar18 * fVar22;
      auVar55 = vsubps_avx(auVar57,auVar46);
      pfVar1 = (float *)(uVar40 + 0x60 + lVar36);
      fVar23 = *pfVar1;
      fVar24 = pfVar1[1];
      fVar25 = pfVar1[2];
      fVar26 = pfVar1[3];
      auVar58._0_4_ = fVar23 * fVar19;
      auVar58._4_4_ = fVar24 * fVar20;
      auVar58._8_4_ = fVar25 * fVar21;
      auVar58._12_4_ = fVar26 * fVar22;
      pfVar1 = (float *)(uVar40 + 0x30 + lVar36);
      fVar27 = *pfVar1;
      fVar28 = pfVar1[1];
      fVar29 = pfVar1[2];
      fVar30 = pfVar1[3];
      auVar68._0_4_ = fVar96 * fVar27;
      auVar68._4_4_ = fVar97 * fVar28;
      auVar68._8_4_ = fVar98 * fVar29;
      auVar68._12_4_ = fVar99 * fVar30;
      auVar73 = vsubps_avx(auVar68,auVar58);
      auVar69._0_4_ = fVar15 * fVar27;
      auVar69._4_4_ = fVar16 * fVar28;
      auVar69._8_4_ = fVar17 * fVar29;
      auVar69._12_4_ = fVar18 * fVar30;
      auVar92._0_4_ = fVar23 * fVar100;
      auVar92._4_4_ = fVar24 * fVar101;
      auVar92._8_4_ = fVar25 * fVar13;
      auVar92._12_4_ = fVar26 * fVar14;
      auVar56 = vsubps_avx(auVar92,auVar69);
      uVar32 = *(undefined4 *)(ray + k * 4);
      auVar93._4_4_ = uVar32;
      auVar93._0_4_ = uVar32;
      auVar93._8_4_ = uVar32;
      auVar93._12_4_ = uVar32;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + lVar36),auVar93);
      uVar32 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar94._4_4_ = uVar32;
      auVar94._0_4_ = uVar32;
      auVar94._8_4_ = uVar32;
      auVar94._12_4_ = uVar32;
      auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x10 + lVar36),auVar94);
      uVar32 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar95._4_4_ = uVar32;
      auVar95._0_4_ = uVar32;
      auVar95._8_4_ = uVar32;
      auVar95._12_4_ = uVar32;
      auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + lVar36),auVar95);
      fVar45 = *(float *)(ray + k * 4 + 0x50);
      fVar52 = *(float *)(ray + k * 4 + 0x60);
      fVar54 = auVar46._0_4_;
      auVar103._0_4_ = fVar45 * fVar54;
      fVar83 = auVar46._4_4_;
      auVar103._4_4_ = fVar45 * fVar83;
      fVar86 = auVar46._8_4_;
      auVar103._8_4_ = fVar45 * fVar86;
      fVar89 = auVar46._12_4_;
      auVar103._12_4_ = fVar45 * fVar89;
      fVar77 = auVar74._0_4_;
      auVar104._0_4_ = fVar52 * fVar77;
      fVar84 = auVar74._4_4_;
      auVar104._4_4_ = fVar52 * fVar84;
      fVar87 = auVar74._8_4_;
      auVar104._8_4_ = fVar52 * fVar87;
      fVar90 = auVar74._12_4_;
      auVar104._12_4_ = fVar52 * fVar90;
      auVar46 = vsubps_avx(auVar104,auVar103);
      fVar53 = *(float *)(ray + k * 4 + 0x40);
      fVar81 = auVar67._0_4_;
      auVar47._0_4_ = fVar52 * fVar81;
      fVar85 = auVar67._4_4_;
      auVar47._4_4_ = fVar52 * fVar85;
      fVar88 = auVar67._8_4_;
      auVar47._8_4_ = fVar52 * fVar88;
      fVar91 = auVar67._12_4_;
      auVar47._12_4_ = fVar52 * fVar91;
      auVar59._0_4_ = fVar53 * fVar54;
      auVar59._4_4_ = fVar53 * fVar83;
      auVar59._8_4_ = fVar53 * fVar86;
      auVar59._12_4_ = fVar53 * fVar89;
      auVar67 = vsubps_avx(auVar59,auVar47);
      auVar60._0_4_ = fVar53 * fVar77;
      auVar60._4_4_ = fVar53 * fVar84;
      auVar60._8_4_ = fVar53 * fVar87;
      auVar60._12_4_ = fVar53 * fVar90;
      auVar70._0_4_ = fVar45 * fVar81;
      auVar70._4_4_ = fVar45 * fVar85;
      auVar70._8_4_ = fVar45 * fVar88;
      auVar70._12_4_ = fVar45 * fVar91;
      auVar47 = vsubps_avx(auVar70,auVar60);
      local_2690 = auVar55._0_4_;
      fStack_268c = auVar55._4_4_;
      fStack_2688 = auVar55._8_4_;
      fStack_2684 = auVar55._12_4_;
      auVar71._0_4_ = local_2690 * fVar53 + fVar45 * auVar73._0_4_ + fVar52 * auVar56._0_4_;
      auVar71._4_4_ = fStack_268c * fVar53 + fVar45 * auVar73._4_4_ + fVar52 * auVar56._4_4_;
      auVar71._8_4_ = fStack_2688 * fVar53 + fVar45 * auVar73._8_4_ + fVar52 * auVar56._8_4_;
      auVar71._12_4_ = fStack_2684 * fVar53 + fVar45 * auVar73._12_4_ + fVar52 * auVar56._12_4_;
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      auVar55 = vandps_avx(auVar71,auVar61);
      uVar31 = auVar55._0_4_;
      local_25e0._0_4_ =
           (float)(uVar31 ^ (uint)(fVar23 * auVar46._0_4_ +
                                  fVar96 * auVar47._0_4_ + fVar15 * auVar67._0_4_));
      uVar79 = auVar55._4_4_;
      local_25e0._4_4_ =
           (float)(uVar79 ^ (uint)(fVar24 * auVar46._4_4_ +
                                  fVar97 * auVar47._4_4_ + fVar16 * auVar67._4_4_));
      uVar80 = auVar55._8_4_;
      local_25e0._8_4_ =
           (float)(uVar80 ^ (uint)(fVar25 * auVar46._8_4_ +
                                  fVar98 * auVar47._8_4_ + fVar17 * auVar67._8_4_));
      uVar82 = auVar55._12_4_;
      local_25e0._12_4_ =
           (float)(uVar82 ^ (uint)(fVar26 * auVar46._12_4_ +
                                  fVar99 * auVar47._12_4_ + fVar18 * auVar67._12_4_));
      local_25e0._16_4_ =
           (float)(uVar31 ^ (uint)(fVar27 * auVar46._0_4_ +
                                  fVar19 * auVar47._0_4_ + fVar100 * auVar67._0_4_));
      local_25e0._20_4_ =
           (float)(uVar79 ^ (uint)(fVar28 * auVar46._4_4_ +
                                  fVar20 * auVar47._4_4_ + fVar101 * auVar67._4_4_));
      local_25e0._24_4_ =
           (float)(uVar80 ^ (uint)(fVar29 * auVar46._8_4_ +
                                  fVar21 * auVar47._8_4_ + fVar13 * auVar67._8_4_));
      local_25e0._28_4_ =
           (float)(uVar82 ^ (uint)(fVar30 * auVar46._12_4_ +
                                  fVar22 * auVar47._12_4_ + fVar14 * auVar67._12_4_));
      auVar46 = ZEXT816(0) << 0x20;
      auVar55 = vcmpps_avx(local_25e0._0_16_,auVar46,5);
      auVar67 = vcmpps_avx(local_25e0._16_16_,auVar46,5);
      auVar55 = vandps_avx(auVar55,auVar67);
      auVar62._8_4_ = 0x7fffffff;
      auVar62._0_8_ = 0x7fffffff7fffffff;
      auVar62._12_4_ = 0x7fffffff;
      local_25b0 = vandps_avx(auVar71,auVar62);
      auVar67 = vcmpps_avx(auVar46,auVar71,4);
      auVar55 = vandps_avx(auVar55,auVar67);
      auVar48._0_4_ = local_25e0._0_4_ + local_25e0._16_4_;
      auVar48._4_4_ = local_25e0._4_4_ + local_25e0._20_4_;
      auVar48._8_4_ = local_25e0._8_4_ + local_25e0._24_4_;
      auVar48._12_4_ = local_25e0._12_4_ + local_25e0._28_4_;
      auVar67 = vcmpps_avx(auVar48,local_25b0,2);
      auVar46 = auVar67 & auVar55;
      if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar46[0xf] < '\0'
         ) {
        auVar55 = vandps_avx(auVar55,auVar67);
        local_25c0._0_4_ =
             (float)(uVar31 ^ (uint)(local_2690 * fVar81 +
                                    fVar77 * auVar73._0_4_ + fVar54 * auVar56._0_4_));
        local_25c0._4_4_ =
             (float)(uVar79 ^ (uint)(fStack_268c * fVar85 +
                                    fVar84 * auVar73._4_4_ + fVar83 * auVar56._4_4_));
        local_25c0._8_4_ =
             (float)(uVar80 ^ (uint)(fStack_2688 * fVar88 +
                                    fVar87 * auVar73._8_4_ + fVar86 * auVar56._8_4_));
        local_25c0._12_4_ =
             (float)(uVar82 ^ (uint)(fStack_2684 * fVar91 +
                                    fVar90 * auVar73._12_4_ + fVar89 * auVar56._12_4_));
        fVar45 = *(float *)(ray + k * 4 + 0x30);
        fVar52 = local_25b0._0_4_;
        auVar49._0_4_ = fVar52 * fVar45;
        fVar53 = local_25b0._4_4_;
        auVar49._4_4_ = fVar53 * fVar45;
        fVar54 = local_25b0._8_4_;
        auVar49._8_4_ = fVar54 * fVar45;
        fVar77 = local_25b0._12_4_;
        auVar49._12_4_ = fVar77 * fVar45;
        auVar67 = vcmpps_avx(auVar49,local_25c0,1);
        fVar45 = *(float *)(ray + k * 4 + 0x80);
        auVar51 = ZEXT1664(CONCAT412(fVar45,CONCAT48(fVar45,CONCAT44(fVar45,fVar45))));
        auVar63._0_4_ = fVar52 * fVar45;
        auVar63._4_4_ = fVar53 * fVar45;
        auVar63._8_4_ = fVar54 * fVar45;
        auVar63._12_4_ = fVar77 * fVar45;
        auVar46 = vcmpps_avx(local_25c0,auVar63,2);
        auVar67 = vandps_avx(auVar67,auVar46);
        auVar46 = auVar55 & auVar67;
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          local_2670 = vandps_avx(auVar55,auVar67);
          local_2590 = local_2670;
          local_2550[0] = local_2690;
          local_2550[1] = fStack_268c;
          local_2550[2] = fStack_2688;
          local_2550[3] = fStack_2684;
          local_26a0 = auVar73._0_8_;
          uStack_2698 = auVar73._8_8_;
          local_2540 = local_26a0;
          uStack_2538 = uStack_2698;
          local_26b0 = auVar56._0_8_;
          uStack_26a8 = auVar56._8_8_;
          local_2530 = local_26b0;
          uStack_2528 = uStack_26a8;
          uStack_2648 = auVar74._8_8_;
          local_2650 = context->scene;
          auVar55 = vrcpps_avx(local_25b0);
          fVar45 = auVar55._0_4_;
          auVar64._0_4_ = fVar52 * fVar45;
          fVar52 = auVar55._4_4_;
          auVar64._4_4_ = fVar53 * fVar52;
          fVar53 = auVar55._8_4_;
          auVar64._8_4_ = fVar54 * fVar53;
          fVar54 = auVar55._12_4_;
          auVar64._12_4_ = fVar77 * fVar54;
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar55 = vsubps_avx(auVar72,auVar64);
          fVar45 = fVar45 + fVar45 * auVar55._0_4_;
          fVar52 = fVar52 + fVar52 * auVar55._4_4_;
          fVar53 = fVar53 + fVar53 * auVar55._8_4_;
          fVar54 = fVar54 + fVar54 * auVar55._12_4_;
          local_2560._0_4_ = fVar45 * local_25c0._0_4_;
          local_2560._4_4_ = fVar52 * local_25c0._4_4_;
          local_2560._8_4_ = fVar53 * local_25c0._8_4_;
          local_2560._12_4_ = fVar54 * local_25c0._12_4_;
          auVar75 = ZEXT1664(local_2560);
          local_2580[0] = fVar45 * local_25e0._0_4_;
          local_2580[1] = fVar52 * local_25e0._4_4_;
          local_2580[2] = fVar53 * local_25e0._8_4_;
          local_2580[3] = fVar54 * local_25e0._12_4_;
          auVar65._8_4_ = 0x7f800000;
          auVar65._0_8_ = 0x7f8000007f800000;
          auVar65._12_4_ = 0x7f800000;
          auVar55 = vblendvps_avx(auVar65,local_2560,local_2670);
          local_2570[0] = fVar45 * local_25e0._16_4_;
          local_2570[1] = fVar52 * local_25e0._20_4_;
          local_2570[2] = fVar53 * local_25e0._24_4_;
          local_2570[3] = fVar54 * local_25e0._28_4_;
          auVar67 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar67 = vminps_avx(auVar67,auVar55);
          auVar73 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vminps_avx(auVar73,auVar67);
          auVar55 = vcmpps_avx(auVar55,auVar67,0);
          auVar73 = local_2670 & auVar55;
          auVar67 = vpcmpeqd_avx(auVar67,auVar67);
          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar73[0xf] < '\0') {
            auVar67 = auVar55;
          }
          lVar36 = lVar36 + uVar40;
          auVar55 = vandps_avx(local_2670,auVar67);
          uVar32 = vmovmskps_avx(auVar55);
          uVar37 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar32);
          lVar34 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
LAB_00fd1683:
          local_2660 = auVar51._0_16_;
          uVar31 = *(uint *)(lVar36 + 0x90 + lVar34 * 4);
          lVar4 = *(long *)(*(long *)((long)local_2650 + 0x1e8) + (ulong)uVar31 * 8);
          if ((*(uint *)(lVar4 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_2670 + lVar34 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) && (*(long *)(lVar4 + 0x40) == 0)
               ) {
              fVar45 = local_2580[lVar34];
              fVar52 = local_2570[lVar34];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar34 * 4);
              *(float *)(ray + k * 4 + 0xc0) = local_2550[lVar34];
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_2540 + lVar34 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_2530 + lVar34 * 4);
              *(float *)(ray + k * 4 + 0xf0) = fVar45;
              *(float *)(ray + k * 4 + 0x100) = fVar52;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar36 + 0xa0 + lVar34 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar31;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_00fd14dd;
            }
            local_2520 = auVar75._0_16_;
            fVar45 = local_2580[lVar34];
            local_24e0._4_4_ = fVar45;
            local_24e0._0_4_ = fVar45;
            local_24e0._8_4_ = fVar45;
            local_24e0._12_4_ = fVar45;
            local_24d0 = local_2570[lVar34];
            local_24b0 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
            uVar32 = *(undefined4 *)(lVar36 + 0xa0 + lVar34 * 4);
            local_24c0._4_4_ = uVar32;
            local_24c0._0_4_ = uVar32;
            local_24c0._8_4_ = uVar32;
            local_24c0._12_4_ = uVar32;
            fVar45 = local_2550[lVar34];
            local_2500 = *(undefined4 *)((long)&local_2540 + lVar34 * 4);
            uVar32 = *(undefined4 *)((long)&local_2530 + lVar34 * 4);
            local_24f0._4_4_ = uVar32;
            local_24f0._0_4_ = uVar32;
            local_24f0._8_4_ = uVar32;
            local_24f0._12_4_ = uVar32;
            local_2510[0] = (RTCHitN)SUB41(fVar45,0);
            local_2510[1] = (RTCHitN)(char)((uint)fVar45 >> 8);
            local_2510[2] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
            local_2510[3] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
            local_2510[4] = (RTCHitN)SUB41(fVar45,0);
            local_2510[5] = (RTCHitN)(char)((uint)fVar45 >> 8);
            local_2510[6] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
            local_2510[7] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
            local_2510[8] = (RTCHitN)SUB41(fVar45,0);
            local_2510[9] = (RTCHitN)(char)((uint)fVar45 >> 8);
            local_2510[10] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
            local_2510[0xb] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
            local_2510[0xc] = (RTCHitN)SUB41(fVar45,0);
            local_2510[0xd] = (RTCHitN)(char)((uint)fVar45 >> 8);
            local_2510[0xe] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
            local_2510[0xf] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
            uStack_24fc = local_2500;
            uStack_24f8 = local_2500;
            uStack_24f4 = local_2500;
            fStack_24cc = local_24d0;
            fStack_24c8 = local_24d0;
            fStack_24c4 = local_24d0;
            vcmpps_avx(ZEXT1632(local_24e0),ZEXT1632(local_24e0),0xf);
            uStack_249c = context->user->instID[0];
            local_24a0 = uStack_249c;
            uStack_2498 = uStack_249c;
            uStack_2494 = uStack_249c;
            uStack_2490 = context->user->instPrimID[0];
            uStack_248c = uStack_2490;
            uStack_2488 = uStack_2490;
            uStack_2484 = uStack_2490;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar34 * 4);
            local_2640 = *local_2618;
            local_2610.valid = (int *)local_2640;
            local_2610.geometryUserPtr = *(void **)(lVar4 + 0x18);
            local_2610.context = context->user;
            local_2610.hit = local_2510;
            local_2610.N = 4;
            local_2630 = lVar39;
            local_2628 = lVar35;
            local_2620 = uVar38;
            local_2610.ray = (RTCRayN *)ray;
            if (*(code **)(lVar4 + 0x40) != (code *)0x0) {
              (**(code **)(lVar4 + 0x40))(&local_2610);
            }
            if (local_2640 == (undefined1  [16])0x0) {
              auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar55 = auVar55 ^ _DAT_01f46b70;
            }
            else {
              p_Var5 = context->args->filter;
              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar4 + 0x3e) & 0x40) != 0)))) {
                (*p_Var5)(&local_2610);
              }
              auVar67 = vpcmpeqd_avx(local_2640,_DAT_01f45a50);
              auVar55 = auVar67 ^ _DAT_01f46b70;
              if (local_2640 != (undefined1  [16])0x0) {
                auVar67 = auVar67 ^ _DAT_01f46b70;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])local_2610.hit);
                *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar73;
                auVar73 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar73;
                auVar67 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar67;
              }
            }
            auVar50._8_8_ = 0x100000001;
            auVar50._0_8_ = 0x100000001;
            if ((auVar50 & auVar55) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_2660._0_4_;
            }
            else {
              local_2660 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_2670 + lVar34 * 4) = 0;
            auVar51 = ZEXT1664(local_2660);
            auVar55 = vshufps_avx(local_2660,local_2660,0);
            auVar75 = ZEXT1664(local_2520);
            auVar55 = vcmpps_avx(local_2520,auVar55,2);
            local_2670 = vandps_avx(auVar55,local_2670);
            uVar38 = local_2620;
            lVar35 = local_2628;
            lVar39 = local_2630;
          }
          if ((((local_2670 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_2670 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_2670 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_2670[0xf]) goto LAB_00fd14dd;
          auVar66._8_4_ = 0x7f800000;
          auVar66._0_8_ = 0x7f8000007f800000;
          auVar66._12_4_ = 0x7f800000;
          auVar55 = vblendvps_avx(auVar66,auVar75._0_16_,local_2670);
          auVar67 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar67 = vminps_avx(auVar67,auVar55);
          auVar73 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vminps_avx(auVar73,auVar67);
          auVar67 = vcmpps_avx(auVar55,auVar67,0);
          auVar73 = local_2670 & auVar67;
          auVar55 = local_2670;
          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar73[0xf] < '\0') {
            auVar55 = vandps_avx(auVar67,local_2670);
          }
          uVar32 = vmovmskps_avx(auVar55);
          uVar37 = CONCAT44((int)((ulong)lVar34 >> 0x20),uVar32);
          lVar34 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          goto LAB_00fd1683;
        }
      }
LAB_00fd14dd:
      auVar75 = ZEXT3264(local_23c0);
      auVar76 = ZEXT3264(local_23e0);
      auVar78 = ZEXT3264(local_2400);
      auVar102 = ZEXT3264(local_2480);
      fVar45 = local_2420;
      fVar54 = fStack_241c;
      fVar77 = fStack_2418;
      fVar81 = fStack_2414;
      fVar83 = fStack_2410;
      fVar84 = fStack_240c;
      fVar85 = fStack_2408;
      fVar52 = local_2440;
      fVar86 = fStack_243c;
      fVar87 = fStack_2438;
      fVar88 = fStack_2434;
      fVar89 = fStack_2430;
      fVar90 = fStack_242c;
      fVar91 = fStack_2428;
      fVar53 = local_2460;
      fVar96 = fStack_245c;
      fVar97 = fStack_2458;
      fVar98 = fStack_2454;
      fVar99 = fStack_2450;
      fVar100 = fStack_244c;
      fVar101 = fStack_2448;
    }
    uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar51 = ZEXT3264(CONCAT428(uVar32,CONCAT424(uVar32,CONCAT420(uVar32,CONCAT416(uVar32,CONCAT412
                                                  (uVar32,CONCAT48(uVar32,CONCAT44(uVar32,uVar32))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }